

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O3

ModulePtr __thiscall
chaiscript::bootstrap::construct_pod<signed_char>(bootstrap *this,string *type,ModulePtr *m)

{
  element_type *peVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ModulePtr MVar5;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<std::shared_ptr<signed_char>,chaiscript::Boxed_Number_const&>
            ((chaiscript *)&sStack_58,detail::construct_pod<signed_char>);
  pcVar2 = (type->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + type->_M_string_length);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&sStack_58,&local_48);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (sStack_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_01;
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var3 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var3;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr construct_pod(const std::string &type, ModulePtr m = std::make_shared<Module>())
    {
      m->add(fun(&detail::construct_pod<T>), type);
      return m;
    }